

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  String *pSVar1;
  pointer pbVar2;
  bool bVar3;
  ValueType VVar4;
  Json *pJVar5;
  Value *root;
  LargestUInt value_00;
  LargestInt value_01;
  char *pcVar6;
  PrecisionType in_R8D;
  pointer key;
  double value_02;
  char *str;
  char *end;
  String local_70;
  Members local_50;
  char *local_38;
  
  VVar4 = Value::type(value);
  switch(VVar4) {
  case nullValue:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"null","");
    pushValue(this,&local_70);
    goto LAB_00137b4b;
  case intValue:
    pJVar5 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_70,pJVar5,value_01);
    pushValue(this,&local_70);
    break;
  case uintValue:
    pJVar5 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_70,pJVar5,value_00);
    pushValue(this,&local_70);
    break;
  case realValue:
    value_02 = Value::asDouble(value);
    (anonymous_namespace)::valueToString_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)0x0,value_02,true,0,in_R8D);
    pushValue(this,&local_70);
    break;
  case stringValue:
    bVar3 = Value::getString(value,(char **)&local_50,&local_38);
    if (bVar3) {
      valueToQuotedStringN_abi_cxx11_
                (&local_70,
                 (Json *)local_50.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 local_38 +
                 -(long)local_50.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0,SUB41(in_R8D,0));
      pushValue(this,&local_70);
      break;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    pushValue(this,&local_70);
LAB_00137b4b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    goto LAB_00137a99;
  case booleanValue:
    bVar3 = Value::asBool(value);
    pcVar6 = "false";
    if (bVar3) {
      pcVar6 = "true";
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar6,pcVar6 + ((ulong)bVar3 ^ 5));
    pushValue(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    goto LAB_00137a99;
  case arrayValue:
    writeArrayValue(this,value);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&local_50,value);
    if (local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{}","");
      pushValue(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00137a4f;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{","");
      writeIndent(this);
      pSVar1 = &this->document_;
      std::__cxx11::string::_M_append((char *)pSVar1,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      indent(this);
      key = local_50.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        root = Value::operator[](value,key);
        writeCommentBeforeValue(this,root);
        valueToQuotedStringN_abi_cxx11_
                  (&local_70,(Json *)(key->_M_dataplus)._M_p,(char *)key->_M_string_length,0,
                   SUB41(in_R8D,0));
        writeIndent(this);
        std::__cxx11::string::_M_append((char *)pSVar1,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)pSVar1);
        writeValue(this,root);
        pbVar2 = local_50.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        key = key + 1;
        if (key != local_50.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::push_back((char)pSVar1);
        }
        writeCommentAfterValueOnSameLine(this,root);
      } while (key != pbVar2);
      unindent(this);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"}","");
      writeIndent(this);
      std::__cxx11::string::_M_append((char *)pSVar1,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00137a4f:
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
  default:
    goto switchD_001377fb_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00137a99:
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
switchD_001377fb_default:
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue: {
    // Is NULL possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok)
      pushValue(valueToQuotedStringN(str, static_cast<size_t>(end - str)));
    else
      pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      auto it = members.begin();
      for (;;) {
        const String& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str(), name.size()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}